

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O2

void Gia_ManCompareValues(Gia_Man_t *p,Vec_Wrd_t *vSimsIn,Vec_Int_t *vValues,char *pDumpFile)

{
  int iVar1;
  uint Guess;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  word *pwVar6;
  uint Correct;
  ulong uVar7;
  
  iVar2 = vSimsIn->nSize / p->vCis->nSize;
  iVar1 = vValues->nSize;
  if (iVar1 != iVar2 * 0x40) {
    __assert_fail("Vec_IntSize(vValues) == nWords * 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x1a1,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)")
    ;
  }
  Gia_ManSimulateWordsInit(p,vSimsIn);
  if (p->nSimWords == iVar2) {
    Correct = 0;
    pObj = Gia_ManCo(p,0);
    iVar3 = Gia_ObjId(p,pObj);
    pwVar6 = Gia_ManObjSim(p,iVar3);
    uVar7 = 0;
    while( true ) {
      uVar4 = vValues->nSize;
      iVar3 = (int)uVar7;
      if ((int)uVar4 <= iVar3) break;
      uVar4 = Vec_IntEntry(vValues,iVar3);
      Correct = Correct + (((pwVar6[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) == uVar4);
      uVar7 = (ulong)(iVar3 + 1);
    }
    uVar5 = Vec_IntSum(vValues);
    Guess = iVar1 - uVar5;
    if (iVar2 * 0x20 < (int)uVar5) {
      Guess = uVar5;
    }
    printf("Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n"
           ,((double)(int)Correct * 100.0) / (double)(int)uVar4,
           ((double)(int)Guess * 100.0) / (double)(int)uVar4,(ulong)uVar4,(ulong)(uVar4 - Correct),
           (ulong)Correct,(ulong)Guess);
    if (pDumpFile != (char *)0x0) {
      Gia_ManSimLogStats(p,pDumpFile,vValues->nSize,Correct,Guess);
      printf("Finished dumping statistics into file \"%s\".\n",pDumpFile);
      return;
    }
    return;
  }
  __assert_fail("p->nSimWords == nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                ,0x1a3,"void Gia_ManCompareValues(Gia_Man_t *, Vec_Wrd_t *, Vec_Int_t *, char *)");
}

Assistant:

void Gia_ManCompareValues( Gia_Man_t * p, Vec_Wrd_t * vSimsIn, Vec_Int_t * vValues, char * pDumpFile )
{
    int i, Value, Guess, Count = 0, nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    word * pSims;
    assert( Vec_IntSize(vValues) == nWords * 64 );
    Gia_ManSimulateWordsInit( p, vSimsIn );
    assert( p->nSimWords == nWords );
    pSims = Gia_ManObjSim( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    Vec_IntForEachEntry( vValues, Value, i )
        if ( Abc_TtGetBit(pSims, i) == Value )
            Count++;
    Guess = (Vec_IntSum(vValues) > nWords * 32) ? Vec_IntSum(vValues) : nWords * 64 - Vec_IntSum(vValues);
    printf( "Total = %6d.  Errors = %6d.  Correct = %6d.  (%6.2f %%)   Naive guess = %6d.  (%6.2f %%)\n", 
        Vec_IntSize(vValues), Vec_IntSize(vValues) - Count, 
        Count, 100.0*Count/Vec_IntSize(vValues),
        Guess, 100.0*Guess/Vec_IntSize(vValues));
    if ( pDumpFile == NULL )
        return;
    Gia_ManSimLogStats( p, pDumpFile, Vec_IntSize(vValues), Count, Guess );
    printf( "Finished dumping statistics into file \"%s\".\n", pDumpFile );
}